

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O2

void Function_Template::SetupFunction(string *namespaceName)

{
  bool bVar1;
  ThreadPool *this;
  
  bVar1 = std::operator==(namespaceName,"function_pool");
  if (bVar1) {
    simd::EnableSimd(true);
    this = ThreadPoolMonoid::instance();
    ThreadPool::resize(this,4);
    return;
  }
  bVar1 = std::operator==(namespaceName,"image_function_avx");
  if (bVar1) {
    simd::EnableSimd(false);
    simd::EnableAvx(true);
    return;
  }
  bVar1 = std::operator==(namespaceName,"image_function_sse");
  if (bVar1) {
    simd::EnableSimd(false);
    simd::EnableSse(true);
    return;
  }
  bVar1 = std::operator==(namespaceName,"image_function_neon");
  if (bVar1) {
    simd::EnableSimd(false);
    simd::EnableNeon(true);
    return;
  }
  return;
}

Assistant:

void SetupFunction( const std::string & namespaceName )
    {
        if ( namespaceName == "function_pool" ) {
            simd::EnableSimd( true );
            ThreadPoolMonoid::instance().resize( 4 );
        }
        else if ( namespaceName == "image_function_avx" ) {
            simd::EnableSimd( false );
            simd::EnableAvx( true );
        }
        else if ( namespaceName == "image_function_sse" ) {
            simd::EnableSimd( false );
            simd::EnableSse( true );
        }
        else if ( namespaceName == "image_function_neon" ) {
            simd::EnableSimd( false );
            simd::EnableNeon( true );
        }
    }